

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O3

ggml_tensor * __thiscall
llm_graph_context::build_ffn
          (llm_graph_context *this,ggml_tensor *cur,ggml_tensor *up,ggml_tensor *up_b,
          ggml_tensor *up_s,ggml_tensor *gate,ggml_tensor *gate_b,ggml_tensor *gate_s,
          ggml_tensor *down,ggml_tensor *down_b,ggml_tensor *down_s,ggml_tensor *act_scales,
          llm_ffn_op_type type_op,llm_ffn_gate_type type_gate,int il)

{
  ggml_context *pgVar1;
  int64_t iVar2;
  size_t sVar3;
  ggml_tensor *__args_1;
  ggml_tensor *pgVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  char *__args_2;
  llama_ubatch *__args;
  llm_graph_cb *this_00;
  long lVar8;
  
  __args_1 = cur;
  if (up != (ggml_tensor *)0x0) {
    __args_1 = build_lora_mm(this,up,cur);
  }
  if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
              (this->cb_func,this->ubatch,__args_1,"ffn_up",il);
  }
  if (up_b != (ggml_tensor *)0x0) {
    __args_1 = (ggml_tensor *)ggml_add(this->ctx0,__args_1,up_b);
    if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
                (this->cb_func,this->ubatch,__args_1,"ffn_up_b",il);
    }
  }
  if (up_s != (ggml_tensor *)0x0) {
    __args_1 = (ggml_tensor *)ggml_mul(this->ctx0,__args_1,up_s);
    if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
                (this->cb_func,this->ubatch,__args_1,"ffn_up_s",il);
    }
  }
  pgVar4 = __args_1;
  if (gate != (ggml_tensor *)0x0) {
    pgVar4 = cur;
    if ((type_gate == LLM_FFN_PAR) || (pgVar4 = __args_1, type_gate == LLM_FFN_SEQ)) {
      cur = build_lora_mm(this,gate,pgVar4);
      if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
        std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
                  (this->cb_func,this->ubatch,cur,"ffn_gate",il);
      }
    }
    if (gate_b != (ggml_tensor *)0x0) {
      cur = (ggml_tensor *)ggml_add(this->ctx0,cur,gate_b);
      if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
        std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
                  (this->cb_func,this->ubatch,cur,"ffn_gate_b",il);
      }
    }
    pgVar4 = cur;
    if (gate_s != (ggml_tensor *)0x0) {
      pgVar4 = (ggml_tensor *)ggml_mul(this->ctx0,cur,gate_s);
      if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
        std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
                  (this->cb_func,this->ubatch,pgVar4,"ffn_gate_s",il);
      }
    }
  }
  switch(type_op) {
  case LLM_FFN_SILU:
    pgVar4 = (ggml_tensor *)ggml_silu(this->ctx0,pgVar4);
    this_00 = this->cb_func;
    if ((this_00->super__Function_base)._M_manager == (_Manager_type)0x0)
    goto switchD_001ac042_default;
    __args = this->ubatch;
    __args_2 = "ffn_silu";
    break;
  case LLM_FFN_GELU:
    pgVar4 = (ggml_tensor *)ggml_gelu(this->ctx0,pgVar4);
    if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
                (this->cb_func,this->ubatch,pgVar4,"ffn_gelu",il);
    }
    if (act_scales == (ggml_tensor *)0x0) goto switchD_001ac042_default;
    pgVar4 = (ggml_tensor *)ggml_div(this->ctx0,pgVar4,act_scales);
    this_00 = this->cb_func;
    if ((this_00->super__Function_base)._M_manager == (_Manager_type)0x0)
    goto switchD_001ac042_default;
    __args = this->ubatch;
    __args_2 = "ffn_act";
    break;
  case LLM_FFN_RELU:
    pgVar4 = (ggml_tensor *)ggml_relu(this->ctx0,pgVar4);
    this_00 = this->cb_func;
    if ((this_00->super__Function_base)._M_manager == (_Manager_type)0x0)
    goto switchD_001ac042_default;
    __args = this->ubatch;
    __args_2 = "ffn_relu";
    break;
  case LLM_FFN_RELU_SQR:
    pgVar4 = (ggml_tensor *)ggml_relu(this->ctx0,pgVar4);
    if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
                (this->cb_func,this->ubatch,pgVar4,"ffn_relu",il);
    }
    pgVar4 = (ggml_tensor *)ggml_sqr(this->ctx0,pgVar4);
    this_00 = this->cb_func;
    if ((this_00->super__Function_base)._M_manager == (_Manager_type)0x0)
    goto switchD_001ac042_default;
    __args = this->ubatch;
    __args_2 = "ffn_sqr(relu)";
    break;
  case LLM_FFN_SWIGLU:
    lVar8 = pgVar4->ne[0] / 2;
    pgVar1 = this->ctx0;
    uVar5 = ggml_view_2d(pgVar1,pgVar4,lVar8,pgVar4->ne[1],pgVar4->nb[1],0);
    uVar5 = ggml_cont(pgVar1,uVar5);
    pgVar1 = this->ctx0;
    iVar2 = pgVar4->ne[1];
    sVar3 = pgVar4->nb[1];
    lVar6 = ggml_element_size(pgVar4);
    uVar7 = ggml_view_2d(pgVar1,pgVar4,lVar8,iVar2,sVar3,lVar6 * lVar8);
    uVar7 = ggml_cont(pgVar1,uVar7);
    uVar5 = ggml_silu(this->ctx0,uVar5);
    if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
                (this->cb_func,this->ubatch,pgVar4,"ffn_silu",il);
    }
    pgVar4 = (ggml_tensor *)ggml_mul(this->ctx0,uVar5,uVar7);
    this_00 = this->cb_func;
    if ((this_00->super__Function_base)._M_manager == (_Manager_type)0x0)
    goto switchD_001ac042_default;
    __args = this->ubatch;
    __args_2 = "ffn_mul";
    break;
  default:
    goto switchD_001ac042_default;
  }
  std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
            (this_00,__args,pgVar4,__args_2,il);
switchD_001ac042_default:
  if (type_gate == LLM_FFN_PAR) {
    pgVar4 = (ggml_tensor *)ggml_mul(this->ctx0,pgVar4,__args_1);
    if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
                (this->cb_func,this->ubatch,pgVar4,"ffn_gate_par",il);
    }
  }
  if ((down != (ggml_tensor *)0x0) &&
     (pgVar4 = build_lora_mm(this,down,pgVar4), this->arch == LLM_ARCH_GLM4)) {
    ggml_mul_mat_set_prec(pgVar4,1);
  }
  if (down_b != (ggml_tensor *)0x0) {
    if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
                (this->cb_func,this->ubatch,pgVar4,"ffn_down",il);
    }
    pgVar4 = (ggml_tensor *)ggml_add(this->ctx0,pgVar4,down_b);
  }
  if (down_s != (ggml_tensor *)0x0) {
    pgVar4 = (ggml_tensor *)ggml_mul(this->ctx0,pgVar4,down_s);
    if ((this->cb_func->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::operator()
                (this->cb_func,this->ubatch,pgVar4,"ffn_down_s",il);
    }
  }
  return pgVar4;
}

Assistant:

ggml_tensor * llm_graph_context::build_ffn(
         ggml_tensor * cur,
         ggml_tensor * up,
         ggml_tensor * up_b,
         ggml_tensor * up_s,
         ggml_tensor * gate,
         ggml_tensor * gate_b,
         ggml_tensor * gate_s,
         ggml_tensor * down,
         ggml_tensor * down_b,
         ggml_tensor * down_s,
         ggml_tensor * act_scales,
     llm_ffn_op_type   type_op,
   llm_ffn_gate_type   type_gate,
                 int   il) const {
    ggml_tensor * tmp = up ? build_lora_mm(up, cur) : cur;
    cb(tmp, "ffn_up", il);

    if (up_b) {
        tmp = ggml_add(ctx0, tmp, up_b);
        cb(tmp, "ffn_up_b", il);
    }

    if (up_s) {
        tmp = ggml_mul(ctx0, tmp, up_s);
        cb(tmp, "ffn_up_s", il);
    }

    if (gate) {
        switch (type_gate) {
            case LLM_FFN_SEQ:
                {
                    cur = build_lora_mm(gate, tmp);
                    cb(cur, "ffn_gate", il);
                } break;
            case LLM_FFN_PAR:
                {
                    cur = build_lora_mm(gate, cur);
                    cb(cur, "ffn_gate", il);
                } break;
        }

        if (gate_b) {
            cur = ggml_add(ctx0, cur, gate_b);
            cb(cur, "ffn_gate_b", il);
        }

        if (gate_s) {
            cur = ggml_mul(ctx0, cur, gate_s);
            cb(cur, "ffn_gate_s", il);
        }

    } else {
        cur = tmp;
    }

    switch (type_op) {
        case LLM_FFN_SILU:
            {
                cur = ggml_silu(ctx0, cur);
                cb(cur, "ffn_silu", il);
            } break;
        case LLM_FFN_GELU:
            {
                cur = ggml_gelu(ctx0, cur);
                cb(cur, "ffn_gelu", il);
                if (act_scales != NULL) {
                    cur = ggml_div(ctx0, cur, act_scales);
                    cb(cur, "ffn_act", il);
                }
            } break;
        case LLM_FFN_RELU:
            {
                cur = ggml_relu(ctx0, cur);
                cb(cur, "ffn_relu", il);
            } break;
        case LLM_FFN_RELU_SQR:
            {
                cur = ggml_relu(ctx0, cur);
                cb(cur, "ffn_relu", il);

                cur = ggml_sqr(ctx0, cur);
                cb(cur, "ffn_sqr(relu)", il);
            } break;
        case LLM_FFN_SWIGLU:
            {
                // Project to 4h. If using swiglu double the output width, see https://arxiv.org/pdf/2002.05202.pdf
                int64_t split_point = cur->ne[0] / 2;
                ggml_tensor * x0 = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, split_point, cur->ne[1], cur->nb[1], 0));
                ggml_tensor * x1 = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, split_point, cur->ne[1], cur->nb[1], split_point * ggml_element_size(cur)));

                x0 = ggml_silu(ctx0, x0);
                cb(cur, "ffn_silu", il);

                cur = ggml_mul(ctx0, x0, x1);
                cb(cur, "ffn_mul", il);
            } break;
    }

    if (type_gate == LLM_FFN_PAR) {
        cur = ggml_mul(ctx0, cur, tmp);
        cb(cur, "ffn_gate_par", il);
    }

    if (down) {
        cur = build_lora_mm(down, cur);
        if (arch == LLM_ARCH_GLM4) {
            // GLM4 seems to have numerical issues with half-precision accumulators
            ggml_mul_mat_set_prec(cur, GGML_PREC_F32);
        }
    }

    if (down_b) {
        cb(cur, "ffn_down", il);
    }

    if (down_b) {
        cur = ggml_add(ctx0, cur, down_b);
    }

    if (down_s) {
        cur = ggml_mul(ctx0, cur, down_s);
        cb(cur, "ffn_down_s", il);
    }

    return cur;
}